

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  bool bVar1;
  bool from_donated;
  uint32_t uVar2;
  Arena *arena;
  Arena *arena_00;
  InlinedStringField *this;
  InlinedStringField *this_00;
  uint32_t *puVar3;
  uint32_t *puVar4;
  string *psVar5;
  undefined1 local_88 [8];
  string temp;
  uint32 mask;
  uint32 *rhs_state;
  uint32 *lhs_state;
  uint32 index;
  InlinedStringField *rhs_string;
  InlinedStringField *lhs_string;
  Arena *rhs_arena;
  Arena *lhs_arena;
  FieldDescriptor *field_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *r_local;
  
  arena = MessageLite::GetArenaForAllocation(&lhs->super_MessageLite);
  arena_00 = MessageLite::GetArenaForAllocation(&rhs->super_MessageLite);
  this = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,lhs,field);
  this_00 = Reflection::MutableRaw<google::protobuf::internal::InlinedStringField>(r,rhs,field);
  uVar2 = ReflectionSchema::InlinedStringIndex(&r->schema_,field);
  puVar3 = Reflection::MutableInlinedStringDonatedArray(r,lhs);
  puVar4 = Reflection::MutableInlinedStringDonatedArray(r,rhs);
  temp.field_2._12_4_ = 1 << ((byte)uVar2 & 0x1f) ^ 0xffffffff;
  if (arena == arena_00) {
    bVar1 = Reflection::IsInlinedStringDonated(r,lhs,field);
    from_donated = Reflection::IsInlinedStringDonated(r,rhs,field);
    InlinedStringField::Swap
              (this,this_00,(string *)0x0,arena,bVar1,from_donated,puVar3 + (uVar2 >> 5),
               puVar4 + (uVar2 >> 5),temp.field_2._12_4_);
  }
  else {
    psVar5 = InlinedStringField::Get_abi_cxx11_(this);
    std::__cxx11::string::string((string *)local_88,(string *)psVar5);
    psVar5 = InlinedStringField::Get_abi_cxx11_(this_00);
    bVar1 = Reflection::IsInlinedStringDonated(r,lhs,field);
    InlinedStringField::Set
              (this,(string *)0x0,psVar5,arena,bVar1,puVar3 + (uVar2 >> 5),temp.field_2._12_4_);
    bVar1 = Reflection::IsInlinedStringDonated(r,rhs,field);
    InlinedStringField::Set
              (this_00,(string *)0x0,(ConstStringParam)local_88,arena_00,bVar1,puVar4 + (uVar2 >> 5)
               ,temp.field_2._12_4_);
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}